

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

int connection_set_properties(CONNECTION_HANDLE connection,fields properties)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x661;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x661;
    }
    pcVar5 = "NULL connection";
    iVar3 = 0x660;
  }
  else if (connection->connection_state == CONNECTION_STATE_START) {
    if (properties == (fields)0x0) {
      if (connection->properties == (AMQP_VALUE)0x0) {
        return 0;
      }
      amqpvalue_destroy(connection->properties);
      connection->properties = (fields)0x0;
      return 0;
    }
    pAVar2 = amqpvalue_clone(properties);
    if (pAVar2 != (AMQP_VALUE)0x0) {
      if (connection->properties != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(connection->properties);
      }
      connection->properties = pAVar2;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x684;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x684;
    }
    pcVar5 = "Cannot clone connection properties";
    iVar3 = 0x683;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x669;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x669;
    }
    pcVar5 = "Connection already open";
    iVar3 = 0x668;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
            ,"connection_set_properties",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int connection_set_properties(CONNECTION_HANDLE connection, fields properties)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_261: [If connection is NULL, connection_set_properties shall fail and return a non-zero value.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_262: [If connection_set_properties is called after the initial Open frame has been sent, it shall fail and return a non-zero value.] */
        if (connection->connection_state != CONNECTION_STATE_START)
        {
            LogError("Connection already open");
            result = MU_FAILURE;
        }
        else
        {
            if (properties == NULL)
            {
                /* Codes_S_R_S_CONNECTION_01_263: [ If `properties` is NULL, the previously stored properties associated with `connection` shall be freed. ]*/
                if (connection->properties != NULL)
                {
                    fields_destroy(connection->properties);
                    connection->properties = NULL;
                }

                /* Codes_S_R_S_CONNECTION_01_264: [ On success it shall return 0. ]*/
                result = 0;
            }
            else
            {
                fields new_properties;

                /* Codes_S_R_S_CONNECTION_01_265: [ `connection_set_properties` shall copy the contents of `properties` as the properties contents for the connection instance identified by `connection`. ]*/
                /* Codes_S_R_S_CONNECTION_01_266: [ Cloning the properties shall be done by calling `fields_clone`. ]*/
                new_properties = fields_clone(properties);
                if (new_properties == NULL)
                {
                    /* Codes_S_R_S_CONNECTION_01_267: [ If `fields_clone` fails, `connection_set_properties` shall fail and return a non-zero value. ]*/
                    LogError("Cannot clone connection properties");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_S_R_S_CONNECTION_01_268: [ If setting the properties fails, the previous value shall be preserved. ]*/
                    /* Only do the free of the previous value if we could clone the new one*/
                    if (connection->properties != NULL)
                    {
                        fields_destroy(connection->properties);
                    }

                    connection->properties = new_properties;

                    /* Codes_S_R_S_CONNECTION_01_264: [ On success it shall return 0. ]*/
                    result = 0;
                }
            }
        }
    }

    return result;
}